

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O0

void ncnn::convdw3x3s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  undefined8 *puVar42;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _sum0_2;
  __m256 _r24_1;
  __m256 _r23_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _r14_1;
  __m256 _r13_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _r04_1;
  __m256 _r03_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum1_1;
  __m256 _sum0_1;
  __m256 _r28;
  __m256 _r27;
  __m256 _r26;
  __m256 _r25;
  __m256 _r24;
  __m256 _r23;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r18;
  __m256 _r17;
  __m256 _r16;
  __m256 _r15;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _r08;
  __m256 _r07;
  __m256 _r06;
  __m256 _r05;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  int j;
  int i;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  int local_3f88;
  int local_3f84;
  undefined8 *local_3e60;
  undefined8 *local_3e58;
  undefined8 *local_3e50;
  undefined8 *local_3e00;
  int local_3d6c;
  float local_30c0;
  float fStack_30bc;
  float fStack_30b8;
  float fStack_30b4;
  float fStack_30b0;
  float fStack_30ac;
  float fStack_30a8;
  float fStack_30a4;
  float local_2f40;
  float fStack_2f3c;
  float fStack_2f38;
  float fStack_2f34;
  float fStack_2f30;
  float fStack_2f2c;
  float fStack_2f28;
  float fStack_2f24;
  float local_2dc0;
  float fStack_2dbc;
  float fStack_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  float fStack_2da8;
  float fStack_2da4;
  float local_2c40;
  float fStack_2c3c;
  float fStack_2c38;
  float fStack_2c34;
  float fStack_2c30;
  float fStack_2c2c;
  float fStack_2c28;
  float fStack_2c24;
  float local_2ac0;
  float fStack_2abc;
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  float fStack_2aa4;
  float local_2940;
  float fStack_293c;
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float fStack_2924;
  float local_27c0;
  float fStack_27bc;
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  float fStack_27a4;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_1fc0;
  float fStack_1fbc;
  float fStack_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  float fStack_1fa8;
  float fStack_1fa4;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar39 = in_RSI[6];
  lVar40 = in_RDI[7];
  iVar41 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 8;
  lVar2 = *in_RCX;
  for (local_3d6c = 0; local_3d6c < (int)lVar40; local_3d6c = local_3d6c + 1) {
    local_3e00 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_3d6c * in_RSI[2]);
    if (lVar2 == 0) {
      local_4740 = 0;
      uStack_4738 = 0;
      uStack_4730 = 0;
      uStack_4728 = 0;
    }
    else {
      puVar42 = (undefined8 *)(lVar2 + (long)(local_3d6c << 3) * 4);
      local_4740 = *puVar42;
      uStack_4738 = puVar42[1];
      uStack_4730 = puVar42[2];
      uStack_4728 = puVar42[3];
    }
    puVar42 = (undefined8 *)
              (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_3d6c * in_RDX[2]);
    local_3e50 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_3d6c * in_RDI[2]);
    local_3e58 = (undefined8 *)((long)local_3e50 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_3e60 = (undefined8 *)
                 ((long)local_3e50 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    uVar3 = *puVar42;
    uVar4 = puVar42[1];
    uVar5 = puVar42[2];
    uVar6 = puVar42[3];
    uVar7 = puVar42[4];
    uVar8 = puVar42[5];
    uVar9 = puVar42[6];
    uVar10 = puVar42[7];
    uVar11 = puVar42[8];
    uVar12 = puVar42[9];
    uVar13 = puVar42[10];
    uVar14 = puVar42[0xb];
    uVar15 = puVar42[0xc];
    uVar16 = puVar42[0xd];
    uVar17 = puVar42[0xe];
    uVar18 = puVar42[0xf];
    uVar19 = puVar42[0x10];
    uVar20 = puVar42[0x11];
    uVar21 = puVar42[0x12];
    uVar22 = puVar42[0x13];
    uVar23 = puVar42[0x14];
    uVar24 = puVar42[0x15];
    uVar25 = puVar42[0x16];
    uVar26 = puVar42[0x17];
    uVar27 = puVar42[0x18];
    uVar28 = puVar42[0x19];
    uVar29 = puVar42[0x1a];
    uVar30 = puVar42[0x1b];
    uVar31 = puVar42[0x1c];
    uVar32 = puVar42[0x1d];
    uVar33 = puVar42[0x1e];
    uVar34 = puVar42[0x1f];
    uVar35 = puVar42[0x20];
    uVar36 = puVar42[0x21];
    uVar37 = puVar42[0x22];
    uVar38 = puVar42[0x23];
    for (local_3f84 = 0; local_3f84 < (int)lVar39; local_3f84 = local_3f84 + 1) {
      local_3f88 = 0;
      while( true ) {
        local_24c0 = (float)uVar3;
        fStack_24bc = (float)((ulong)uVar3 >> 0x20);
        fStack_24b8 = (float)uVar4;
        fStack_24b4 = (float)((ulong)uVar4 >> 0x20);
        fStack_24b0 = (float)uVar5;
        fStack_24ac = (float)((ulong)uVar5 >> 0x20);
        fStack_24a8 = (float)uVar6;
        fStack_24a4 = (float)((ulong)uVar6 >> 0x20);
        local_1fc0 = (float)local_4740;
        fStack_1fbc = (float)((ulong)local_4740 >> 0x20);
        fStack_1fb8 = (float)uStack_4738;
        fStack_1fb4 = (float)((ulong)uStack_4738 >> 0x20);
        fStack_1fb0 = (float)uStack_4730;
        fStack_1fac = (float)((ulong)uStack_4730 >> 0x20);
        fStack_1fa8 = (float)uStack_4728;
        fStack_1fa4 = (float)((ulong)uStack_4728 >> 0x20);
        local_2640 = (float)uVar7;
        fStack_263c = (float)((ulong)uVar7 >> 0x20);
        fStack_2638 = (float)uVar8;
        fStack_2634 = (float)((ulong)uVar8 >> 0x20);
        fStack_2630 = (float)uVar9;
        fStack_262c = (float)((ulong)uVar9 >> 0x20);
        fStack_2628 = (float)uVar10;
        fStack_2624 = (float)((ulong)uVar10 >> 0x20);
        local_27c0 = (float)uVar11;
        fStack_27bc = (float)((ulong)uVar11 >> 0x20);
        fStack_27b8 = (float)uVar12;
        fStack_27b4 = (float)((ulong)uVar12 >> 0x20);
        fStack_27b0 = (float)uVar13;
        fStack_27ac = (float)((ulong)uVar13 >> 0x20);
        fStack_27a8 = (float)uVar14;
        fStack_27a4 = (float)((ulong)uVar14 >> 0x20);
        local_2940 = (float)uVar15;
        fStack_293c = (float)((ulong)uVar15 >> 0x20);
        fStack_2938 = (float)uVar16;
        fStack_2934 = (float)((ulong)uVar16 >> 0x20);
        fStack_2930 = (float)uVar17;
        fStack_292c = (float)((ulong)uVar17 >> 0x20);
        fStack_2928 = (float)uVar18;
        fStack_2924 = (float)((ulong)uVar18 >> 0x20);
        local_2ac0 = (float)uVar19;
        fStack_2abc = (float)((ulong)uVar19 >> 0x20);
        fStack_2ab8 = (float)uVar20;
        fStack_2ab4 = (float)((ulong)uVar20 >> 0x20);
        fStack_2ab0 = (float)uVar21;
        fStack_2aac = (float)((ulong)uVar21 >> 0x20);
        fStack_2aa8 = (float)uVar22;
        fStack_2aa4 = (float)((ulong)uVar22 >> 0x20);
        local_2c40 = (float)uVar23;
        fStack_2c3c = (float)((ulong)uVar23 >> 0x20);
        fStack_2c38 = (float)uVar24;
        fStack_2c34 = (float)((ulong)uVar24 >> 0x20);
        fStack_2c30 = (float)uVar25;
        fStack_2c2c = (float)((ulong)uVar25 >> 0x20);
        fStack_2c28 = (float)uVar26;
        fStack_2c24 = (float)((ulong)uVar26 >> 0x20);
        local_2dc0 = (float)uVar27;
        fStack_2dbc = (float)((ulong)uVar27 >> 0x20);
        fStack_2db8 = (float)uVar28;
        fStack_2db4 = (float)((ulong)uVar28 >> 0x20);
        fStack_2db0 = (float)uVar29;
        fStack_2dac = (float)((ulong)uVar29 >> 0x20);
        fStack_2da8 = (float)uVar30;
        fStack_2da4 = (float)((ulong)uVar30 >> 0x20);
        local_2f40 = (float)uVar31;
        fStack_2f3c = (float)((ulong)uVar31 >> 0x20);
        fStack_2f38 = (float)uVar32;
        fStack_2f34 = (float)((ulong)uVar32 >> 0x20);
        fStack_2f30 = (float)uVar33;
        fStack_2f2c = (float)((ulong)uVar33 >> 0x20);
        fStack_2f28 = (float)uVar34;
        fStack_2f24 = (float)((ulong)uVar34 >> 0x20);
        local_30c0 = (float)uVar35;
        fStack_30bc = (float)((ulong)uVar35 >> 0x20);
        fStack_30b8 = (float)uVar36;
        fStack_30b4 = (float)((ulong)uVar36 >> 0x20);
        fStack_30b0 = (float)uVar37;
        fStack_30ac = (float)((ulong)uVar37 >> 0x20);
        fStack_30a8 = (float)uVar38;
        fStack_30a4 = (float)((ulong)uVar38 >> 0x20);
        if (iVar1 <= local_3f88 + 3) break;
        local_1000 = (float)*local_3e50;
        fStack_ffc = (float)((ulong)*local_3e50 >> 0x20);
        fStack_ff8 = (float)local_3e50[1];
        fStack_ff4 = (float)((ulong)local_3e50[1] >> 0x20);
        fStack_ff0 = (float)local_3e50[2];
        fStack_fec = (float)((ulong)local_3e50[2] >> 0x20);
        fStack_fe8 = (float)local_3e50[3];
        local_fc0 = (float)local_3e50[8];
        fStack_fbc = (float)((ulong)local_3e50[8] >> 0x20);
        fStack_fb8 = (float)local_3e50[9];
        fStack_fb4 = (float)((ulong)local_3e50[9] >> 0x20);
        fStack_fb0 = (float)local_3e50[10];
        fStack_fac = (float)((ulong)local_3e50[10] >> 0x20);
        fStack_fa8 = (float)local_3e50[0xb];
        local_f80 = (float)local_3e50[0x10];
        fStack_f7c = (float)((ulong)local_3e50[0x10] >> 0x20);
        fStack_f78 = (float)local_3e50[0x11];
        fStack_f74 = (float)((ulong)local_3e50[0x11] >> 0x20);
        fStack_f70 = (float)local_3e50[0x12];
        fStack_f6c = (float)((ulong)local_3e50[0x12] >> 0x20);
        fStack_f68 = (float)local_3e50[0x13];
        local_f40 = (float)local_3e50[0x18];
        fStack_f3c = (float)((ulong)local_3e50[0x18] >> 0x20);
        fStack_f38 = (float)local_3e50[0x19];
        fStack_f34 = (float)((ulong)local_3e50[0x19] >> 0x20);
        fStack_f30 = (float)local_3e50[0x1a];
        fStack_f2c = (float)((ulong)local_3e50[0x1a] >> 0x20);
        fStack_f28 = (float)local_3e50[0x1b];
        local_f00 = (float)local_3e50[4];
        fStack_efc = (float)((ulong)local_3e50[4] >> 0x20);
        fStack_ef8 = (float)local_3e50[5];
        fStack_ef4 = (float)((ulong)local_3e50[5] >> 0x20);
        fStack_ef0 = (float)local_3e50[6];
        fStack_eec = (float)((ulong)local_3e50[6] >> 0x20);
        fStack_ee8 = (float)local_3e50[7];
        local_ec0 = (float)local_3e50[0xc];
        fStack_ebc = (float)((ulong)local_3e50[0xc] >> 0x20);
        fStack_eb8 = (float)local_3e50[0xd];
        fStack_eb4 = (float)((ulong)local_3e50[0xd] >> 0x20);
        fStack_eb0 = (float)local_3e50[0xe];
        fStack_eac = (float)((ulong)local_3e50[0xe] >> 0x20);
        fStack_ea8 = (float)local_3e50[0xf];
        local_e80 = (float)local_3e50[0x14];
        fStack_e7c = (float)((ulong)local_3e50[0x14] >> 0x20);
        fStack_e78 = (float)local_3e50[0x15];
        fStack_e74 = (float)((ulong)local_3e50[0x15] >> 0x20);
        fStack_e70 = (float)local_3e50[0x16];
        fStack_e6c = (float)((ulong)local_3e50[0x16] >> 0x20);
        fStack_e68 = (float)local_3e50[0x17];
        local_e40 = (float)local_3e50[0x1c];
        fStack_e3c = (float)((ulong)local_3e50[0x1c] >> 0x20);
        fStack_e38 = (float)local_3e50[0x1d];
        fStack_e34 = (float)((ulong)local_3e50[0x1d] >> 0x20);
        fStack_e30 = (float)local_3e50[0x1e];
        fStack_e2c = (float)((ulong)local_3e50[0x1e] >> 0x20);
        fStack_e28 = (float)local_3e50[0x1f];
        local_d40 = (float)local_3e50[0x20];
        fStack_d3c = (float)((ulong)local_3e50[0x20] >> 0x20);
        fStack_d38 = (float)local_3e50[0x21];
        fStack_d34 = (float)((ulong)local_3e50[0x21] >> 0x20);
        fStack_d30 = (float)local_3e50[0x22];
        fStack_d2c = (float)((ulong)local_3e50[0x22] >> 0x20);
        fStack_d28 = (float)local_3e50[0x23];
        local_d00 = (float)*local_3e58;
        fStack_cfc = (float)((ulong)*local_3e58 >> 0x20);
        fStack_cf8 = (float)local_3e58[1];
        fStack_cf4 = (float)((ulong)local_3e58[1] >> 0x20);
        fStack_cf0 = (float)local_3e58[2];
        fStack_cec = (float)((ulong)local_3e58[2] >> 0x20);
        fStack_ce8 = (float)local_3e58[3];
        local_cc0 = (float)local_3e58[8];
        fStack_cbc = (float)((ulong)local_3e58[8] >> 0x20);
        fStack_cb8 = (float)local_3e58[9];
        fStack_cb4 = (float)((ulong)local_3e58[9] >> 0x20);
        fStack_cb0 = (float)local_3e58[10];
        fStack_cac = (float)((ulong)local_3e58[10] >> 0x20);
        fStack_ca8 = (float)local_3e58[0xb];
        local_c80 = (float)local_3e58[0x10];
        fStack_c7c = (float)((ulong)local_3e58[0x10] >> 0x20);
        fStack_c78 = (float)local_3e58[0x11];
        fStack_c74 = (float)((ulong)local_3e58[0x11] >> 0x20);
        fStack_c70 = (float)local_3e58[0x12];
        fStack_c6c = (float)((ulong)local_3e58[0x12] >> 0x20);
        fStack_c68 = (float)local_3e58[0x13];
        local_c40 = (float)local_3e58[0x18];
        fStack_c3c = (float)((ulong)local_3e58[0x18] >> 0x20);
        fStack_c38 = (float)local_3e58[0x19];
        fStack_c34 = (float)((ulong)local_3e58[0x19] >> 0x20);
        fStack_c30 = (float)local_3e58[0x1a];
        fStack_c2c = (float)((ulong)local_3e58[0x1a] >> 0x20);
        fStack_c28 = (float)local_3e58[0x1b];
        local_c00 = (float)local_3e58[4];
        fStack_bfc = (float)((ulong)local_3e58[4] >> 0x20);
        fStack_bf8 = (float)local_3e58[5];
        fStack_bf4 = (float)((ulong)local_3e58[5] >> 0x20);
        fStack_bf0 = (float)local_3e58[6];
        fStack_bec = (float)((ulong)local_3e58[6] >> 0x20);
        fStack_be8 = (float)local_3e58[7];
        local_bc0 = (float)local_3e58[0xc];
        fStack_bbc = (float)((ulong)local_3e58[0xc] >> 0x20);
        fStack_bb8 = (float)local_3e58[0xd];
        fStack_bb4 = (float)((ulong)local_3e58[0xd] >> 0x20);
        fStack_bb0 = (float)local_3e58[0xe];
        fStack_bac = (float)((ulong)local_3e58[0xe] >> 0x20);
        fStack_ba8 = (float)local_3e58[0xf];
        local_b80 = (float)local_3e58[0x14];
        fStack_b7c = (float)((ulong)local_3e58[0x14] >> 0x20);
        fStack_b78 = (float)local_3e58[0x15];
        fStack_b74 = (float)((ulong)local_3e58[0x15] >> 0x20);
        fStack_b70 = (float)local_3e58[0x16];
        fStack_b6c = (float)((ulong)local_3e58[0x16] >> 0x20);
        fStack_b68 = (float)local_3e58[0x17];
        local_b40 = (float)local_3e58[0x1c];
        fStack_b3c = (float)((ulong)local_3e58[0x1c] >> 0x20);
        fStack_b38 = (float)local_3e58[0x1d];
        fStack_b34 = (float)((ulong)local_3e58[0x1d] >> 0x20);
        fStack_b30 = (float)local_3e58[0x1e];
        fStack_b2c = (float)((ulong)local_3e58[0x1e] >> 0x20);
        fStack_b28 = (float)local_3e58[0x1f];
        local_a40 = (float)local_3e58[0x20];
        fStack_a3c = (float)((ulong)local_3e58[0x20] >> 0x20);
        fStack_a38 = (float)local_3e58[0x21];
        fStack_a34 = (float)((ulong)local_3e58[0x21] >> 0x20);
        fStack_a30 = (float)local_3e58[0x22];
        fStack_a2c = (float)((ulong)local_3e58[0x22] >> 0x20);
        fStack_a28 = (float)local_3e58[0x23];
        local_a00 = (float)*local_3e60;
        fStack_9fc = (float)((ulong)*local_3e60 >> 0x20);
        fStack_9f8 = (float)local_3e60[1];
        fStack_9f4 = (float)((ulong)local_3e60[1] >> 0x20);
        fStack_9f0 = (float)local_3e60[2];
        fStack_9ec = (float)((ulong)local_3e60[2] >> 0x20);
        fStack_9e8 = (float)local_3e60[3];
        local_9c0 = (float)local_3e60[8];
        fStack_9bc = (float)((ulong)local_3e60[8] >> 0x20);
        fStack_9b8 = (float)local_3e60[9];
        fStack_9b4 = (float)((ulong)local_3e60[9] >> 0x20);
        fStack_9b0 = (float)local_3e60[10];
        fStack_9ac = (float)((ulong)local_3e60[10] >> 0x20);
        fStack_9a8 = (float)local_3e60[0xb];
        local_980 = (float)local_3e60[0x10];
        fStack_97c = (float)((ulong)local_3e60[0x10] >> 0x20);
        fStack_978 = (float)local_3e60[0x11];
        fStack_974 = (float)((ulong)local_3e60[0x11] >> 0x20);
        fStack_970 = (float)local_3e60[0x12];
        fStack_96c = (float)((ulong)local_3e60[0x12] >> 0x20);
        fStack_968 = (float)local_3e60[0x13];
        local_940 = (float)local_3e60[0x18];
        fStack_93c = (float)((ulong)local_3e60[0x18] >> 0x20);
        fStack_938 = (float)local_3e60[0x19];
        fStack_934 = (float)((ulong)local_3e60[0x19] >> 0x20);
        fStack_930 = (float)local_3e60[0x1a];
        fStack_92c = (float)((ulong)local_3e60[0x1a] >> 0x20);
        fStack_928 = (float)local_3e60[0x1b];
        local_900 = (float)local_3e60[4];
        fStack_8fc = (float)((ulong)local_3e60[4] >> 0x20);
        fStack_8f8 = (float)local_3e60[5];
        fStack_8f4 = (float)((ulong)local_3e60[5] >> 0x20);
        fStack_8f0 = (float)local_3e60[6];
        fStack_8ec = (float)((ulong)local_3e60[6] >> 0x20);
        fStack_8e8 = (float)local_3e60[7];
        local_8c0 = (float)local_3e60[0xc];
        fStack_8bc = (float)((ulong)local_3e60[0xc] >> 0x20);
        fStack_8b8 = (float)local_3e60[0xd];
        fStack_8b4 = (float)((ulong)local_3e60[0xd] >> 0x20);
        fStack_8b0 = (float)local_3e60[0xe];
        fStack_8ac = (float)((ulong)local_3e60[0xe] >> 0x20);
        fStack_8a8 = (float)local_3e60[0xf];
        local_880 = (float)local_3e60[0x14];
        fStack_87c = (float)((ulong)local_3e60[0x14] >> 0x20);
        fStack_878 = (float)local_3e60[0x15];
        fStack_874 = (float)((ulong)local_3e60[0x15] >> 0x20);
        fStack_870 = (float)local_3e60[0x16];
        fStack_86c = (float)((ulong)local_3e60[0x16] >> 0x20);
        fStack_868 = (float)local_3e60[0x17];
        local_840 = (float)local_3e60[0x1c];
        fStack_83c = (float)((ulong)local_3e60[0x1c] >> 0x20);
        fStack_838 = (float)local_3e60[0x1d];
        fStack_834 = (float)((ulong)local_3e60[0x1d] >> 0x20);
        fStack_830 = (float)local_3e60[0x1e];
        fStack_82c = (float)((ulong)local_3e60[0x1e] >> 0x20);
        fStack_828 = (float)local_3e60[0x1f];
        local_740 = (float)local_3e60[0x20];
        fStack_73c = (float)((ulong)local_3e60[0x20] >> 0x20);
        fStack_738 = (float)local_3e60[0x21];
        fStack_734 = (float)((ulong)local_3e60[0x21] >> 0x20);
        fStack_730 = (float)local_3e60[0x22];
        fStack_72c = (float)((ulong)local_3e60[0x22] >> 0x20);
        fStack_728 = (float)local_3e60[0x23];
        *local_3e00 = CONCAT44(fStack_30bc * fStack_9bc +
                               fStack_2f3c * fStack_8fc +
                               fStack_2dbc * fStack_9fc +
                               fStack_2c3c * fStack_cbc +
                               fStack_2abc * fStack_bfc +
                               fStack_293c * fStack_cfc +
                               fStack_27bc * fStack_fbc +
                               fStack_263c * fStack_efc + fStack_24bc * fStack_ffc + fStack_1fbc,
                               local_30c0 * local_9c0 +
                               local_2f40 * local_900 +
                               local_2dc0 * local_a00 +
                               local_2c40 * local_cc0 +
                               local_2ac0 * local_c00 +
                               local_2940 * local_d00 +
                               local_27c0 * local_fc0 +
                               local_2640 * local_f00 + local_24c0 * local_1000 + local_1fc0);
        local_3e00[1] =
             CONCAT44(fStack_30b4 * fStack_9b4 +
                      fStack_2f34 * fStack_8f4 +
                      fStack_2db4 * fStack_9f4 +
                      fStack_2c34 * fStack_cb4 +
                      fStack_2ab4 * fStack_bf4 +
                      fStack_2934 * fStack_cf4 +
                      fStack_27b4 * fStack_fb4 +
                      fStack_2634 * fStack_ef4 + fStack_24b4 * fStack_ff4 + fStack_1fb4,
                      fStack_30b8 * fStack_9b8 +
                      fStack_2f38 * fStack_8f8 +
                      fStack_2db8 * fStack_9f8 +
                      fStack_2c38 * fStack_cb8 +
                      fStack_2ab8 * fStack_bf8 +
                      fStack_2938 * fStack_cf8 +
                      fStack_27b8 * fStack_fb8 +
                      fStack_2638 * fStack_ef8 + fStack_24b8 * fStack_ff8 + fStack_1fb8);
        local_3e00[2] =
             CONCAT44(fStack_30ac * fStack_9ac +
                      fStack_2f2c * fStack_8ec +
                      fStack_2dac * fStack_9ec +
                      fStack_2c2c * fStack_cac +
                      fStack_2aac * fStack_bec +
                      fStack_292c * fStack_cec +
                      fStack_27ac * fStack_fac +
                      fStack_262c * fStack_eec + fStack_24ac * fStack_fec + fStack_1fac,
                      fStack_30b0 * fStack_9b0 +
                      fStack_2f30 * fStack_8f0 +
                      fStack_2db0 * fStack_9f0 +
                      fStack_2c30 * fStack_cb0 +
                      fStack_2ab0 * fStack_bf0 +
                      fStack_2930 * fStack_cf0 +
                      fStack_27b0 * fStack_fb0 +
                      fStack_2630 * fStack_ef0 + fStack_24b0 * fStack_ff0 + fStack_1fb0);
        local_3e00[3] =
             CONCAT44(fStack_30a4 +
                      fStack_2f24 +
                      fStack_2da4 +
                      fStack_2c24 +
                      fStack_2aa4 +
                      fStack_2924 + fStack_27a4 + fStack_2624 + fStack_24a4 + fStack_1fa4,
                      fStack_30a8 * fStack_9a8 +
                      fStack_2f28 * fStack_8e8 +
                      fStack_2da8 * fStack_9e8 +
                      fStack_2c28 * fStack_ca8 +
                      fStack_2aa8 * fStack_be8 +
                      fStack_2928 * fStack_ce8 +
                      fStack_27a8 * fStack_fa8 +
                      fStack_2628 * fStack_ee8 + fStack_24a8 * fStack_fe8 + fStack_1fa8);
        local_3e00[4] =
             CONCAT44(fStack_30bc * fStack_97c +
                      fStack_2f3c * fStack_8bc +
                      fStack_2dbc * fStack_9bc +
                      fStack_2c3c * fStack_c7c +
                      fStack_2abc * fStack_bbc +
                      fStack_293c * fStack_cbc +
                      fStack_27bc * fStack_f7c +
                      fStack_263c * fStack_ebc + fStack_24bc * fStack_fbc + fStack_1fbc,
                      local_30c0 * local_980 +
                      local_2f40 * local_8c0 +
                      local_2dc0 * local_9c0 +
                      local_2c40 * local_c80 +
                      local_2ac0 * local_bc0 +
                      local_2940 * local_cc0 +
                      local_27c0 * local_f80 +
                      local_2640 * local_ec0 + local_24c0 * local_fc0 + local_1fc0);
        local_3e00[5] =
             CONCAT44(fStack_30b4 * fStack_974 +
                      fStack_2f34 * fStack_8b4 +
                      fStack_2db4 * fStack_9b4 +
                      fStack_2c34 * fStack_c74 +
                      fStack_2ab4 * fStack_bb4 +
                      fStack_2934 * fStack_cb4 +
                      fStack_27b4 * fStack_f74 +
                      fStack_2634 * fStack_eb4 + fStack_24b4 * fStack_fb4 + fStack_1fb4,
                      fStack_30b8 * fStack_978 +
                      fStack_2f38 * fStack_8b8 +
                      fStack_2db8 * fStack_9b8 +
                      fStack_2c38 * fStack_c78 +
                      fStack_2ab8 * fStack_bb8 +
                      fStack_2938 * fStack_cb8 +
                      fStack_27b8 * fStack_f78 +
                      fStack_2638 * fStack_eb8 + fStack_24b8 * fStack_fb8 + fStack_1fb8);
        local_3e00[6] =
             CONCAT44(fStack_30ac * fStack_96c +
                      fStack_2f2c * fStack_8ac +
                      fStack_2dac * fStack_9ac +
                      fStack_2c2c * fStack_c6c +
                      fStack_2aac * fStack_bac +
                      fStack_292c * fStack_cac +
                      fStack_27ac * fStack_f6c +
                      fStack_262c * fStack_eac + fStack_24ac * fStack_fac + fStack_1fac,
                      fStack_30b0 * fStack_970 +
                      fStack_2f30 * fStack_8b0 +
                      fStack_2db0 * fStack_9b0 +
                      fStack_2c30 * fStack_c70 +
                      fStack_2ab0 * fStack_bb0 +
                      fStack_2930 * fStack_cb0 +
                      fStack_27b0 * fStack_f70 +
                      fStack_2630 * fStack_eb0 + fStack_24b0 * fStack_fb0 + fStack_1fb0);
        local_3e00[7] =
             CONCAT44(fStack_30a4 +
                      fStack_2f24 +
                      fStack_2da4 +
                      fStack_2c24 +
                      fStack_2aa4 +
                      fStack_2924 + fStack_27a4 + fStack_2624 + fStack_24a4 + fStack_1fa4,
                      fStack_30a8 * fStack_968 +
                      fStack_2f28 * fStack_8a8 +
                      fStack_2da8 * fStack_9a8 +
                      fStack_2c28 * fStack_c68 +
                      fStack_2aa8 * fStack_ba8 +
                      fStack_2928 * fStack_ca8 +
                      fStack_27a8 * fStack_f68 +
                      fStack_2628 * fStack_ea8 + fStack_24a8 * fStack_fa8 + fStack_1fa8);
        local_3e00[8] =
             CONCAT44(fStack_30bc * fStack_93c +
                      fStack_2f3c * fStack_87c +
                      fStack_2dbc * fStack_97c +
                      fStack_2c3c * fStack_c3c +
                      fStack_2abc * fStack_b7c +
                      fStack_293c * fStack_c7c +
                      fStack_27bc * fStack_f3c +
                      fStack_263c * fStack_e7c + fStack_24bc * fStack_f7c + fStack_1fbc,
                      local_30c0 * local_940 +
                      local_2f40 * local_880 +
                      local_2dc0 * local_980 +
                      local_2c40 * local_c40 +
                      local_2ac0 * local_b80 +
                      local_2940 * local_c80 +
                      local_27c0 * local_f40 +
                      local_2640 * local_e80 + local_24c0 * local_f80 + local_1fc0);
        local_3e00[9] =
             CONCAT44(fStack_30b4 * fStack_934 +
                      fStack_2f34 * fStack_874 +
                      fStack_2db4 * fStack_974 +
                      fStack_2c34 * fStack_c34 +
                      fStack_2ab4 * fStack_b74 +
                      fStack_2934 * fStack_c74 +
                      fStack_27b4 * fStack_f34 +
                      fStack_2634 * fStack_e74 + fStack_24b4 * fStack_f74 + fStack_1fb4,
                      fStack_30b8 * fStack_938 +
                      fStack_2f38 * fStack_878 +
                      fStack_2db8 * fStack_978 +
                      fStack_2c38 * fStack_c38 +
                      fStack_2ab8 * fStack_b78 +
                      fStack_2938 * fStack_c78 +
                      fStack_27b8 * fStack_f38 +
                      fStack_2638 * fStack_e78 + fStack_24b8 * fStack_f78 + fStack_1fb8);
        local_3e00[10] =
             CONCAT44(fStack_30ac * fStack_92c +
                      fStack_2f2c * fStack_86c +
                      fStack_2dac * fStack_96c +
                      fStack_2c2c * fStack_c2c +
                      fStack_2aac * fStack_b6c +
                      fStack_292c * fStack_c6c +
                      fStack_27ac * fStack_f2c +
                      fStack_262c * fStack_e6c + fStack_24ac * fStack_f6c + fStack_1fac,
                      fStack_30b0 * fStack_930 +
                      fStack_2f30 * fStack_870 +
                      fStack_2db0 * fStack_970 +
                      fStack_2c30 * fStack_c30 +
                      fStack_2ab0 * fStack_b70 +
                      fStack_2930 * fStack_c70 +
                      fStack_27b0 * fStack_f30 +
                      fStack_2630 * fStack_e70 + fStack_24b0 * fStack_f70 + fStack_1fb0);
        local_3e00[0xb] =
             CONCAT44(fStack_30a4 +
                      fStack_2f24 +
                      fStack_2da4 +
                      fStack_2c24 +
                      fStack_2aa4 +
                      fStack_2924 + fStack_27a4 + fStack_2624 + fStack_24a4 + fStack_1fa4,
                      fStack_30a8 * fStack_928 +
                      fStack_2f28 * fStack_868 +
                      fStack_2da8 * fStack_968 +
                      fStack_2c28 * fStack_c28 +
                      fStack_2aa8 * fStack_b68 +
                      fStack_2928 * fStack_c68 +
                      fStack_27a8 * fStack_f28 +
                      fStack_2628 * fStack_e68 + fStack_24a8 * fStack_f68 + fStack_1fa8);
        local_3e00[0xc] =
             CONCAT44(fStack_30bc * fStack_73c +
                      fStack_2f3c * fStack_83c +
                      fStack_2dbc * fStack_93c +
                      fStack_2c3c * fStack_a3c +
                      fStack_2abc * fStack_b3c +
                      fStack_293c * fStack_c3c +
                      fStack_27bc * fStack_d3c +
                      fStack_263c * fStack_e3c + fStack_24bc * fStack_f3c + fStack_1fbc,
                      local_30c0 * local_740 +
                      local_2f40 * local_840 +
                      local_2dc0 * local_940 +
                      local_2c40 * local_a40 +
                      local_2ac0 * local_b40 +
                      local_2940 * local_c40 +
                      local_27c0 * local_d40 +
                      local_2640 * local_e40 + local_24c0 * local_f40 + local_1fc0);
        local_3e00[0xd] =
             CONCAT44(fStack_30b4 * fStack_734 +
                      fStack_2f34 * fStack_834 +
                      fStack_2db4 * fStack_934 +
                      fStack_2c34 * fStack_a34 +
                      fStack_2ab4 * fStack_b34 +
                      fStack_2934 * fStack_c34 +
                      fStack_27b4 * fStack_d34 +
                      fStack_2634 * fStack_e34 + fStack_24b4 * fStack_f34 + fStack_1fb4,
                      fStack_30b8 * fStack_738 +
                      fStack_2f38 * fStack_838 +
                      fStack_2db8 * fStack_938 +
                      fStack_2c38 * fStack_a38 +
                      fStack_2ab8 * fStack_b38 +
                      fStack_2938 * fStack_c38 +
                      fStack_27b8 * fStack_d38 +
                      fStack_2638 * fStack_e38 + fStack_24b8 * fStack_f38 + fStack_1fb8);
        local_3e00[0xe] =
             CONCAT44(fStack_30ac * fStack_72c +
                      fStack_2f2c * fStack_82c +
                      fStack_2dac * fStack_92c +
                      fStack_2c2c * fStack_a2c +
                      fStack_2aac * fStack_b2c +
                      fStack_292c * fStack_c2c +
                      fStack_27ac * fStack_d2c +
                      fStack_262c * fStack_e2c + fStack_24ac * fStack_f2c + fStack_1fac,
                      fStack_30b0 * fStack_730 +
                      fStack_2f30 * fStack_830 +
                      fStack_2db0 * fStack_930 +
                      fStack_2c30 * fStack_a30 +
                      fStack_2ab0 * fStack_b30 +
                      fStack_2930 * fStack_c30 +
                      fStack_27b0 * fStack_d30 +
                      fStack_2630 * fStack_e30 + fStack_24b0 * fStack_f30 + fStack_1fb0);
        local_3e00[0xf] =
             CONCAT44(fStack_30a4 +
                      fStack_2f24 +
                      fStack_2da4 +
                      fStack_2c24 +
                      fStack_2aa4 +
                      fStack_2924 + fStack_27a4 + fStack_2624 + fStack_24a4 + fStack_1fa4,
                      fStack_30a8 * fStack_728 +
                      fStack_2f28 * fStack_828 +
                      fStack_2da8 * fStack_928 +
                      fStack_2c28 * fStack_a28 +
                      fStack_2aa8 * fStack_b28 +
                      fStack_2928 * fStack_c28 +
                      fStack_27a8 * fStack_d28 +
                      fStack_2628 * fStack_e28 + fStack_24a8 * fStack_f28 + fStack_1fa8);
        local_3e50 = local_3e50 + 0x20;
        local_3e58 = local_3e58 + 0x20;
        local_3e60 = local_3e60 + 0x20;
        local_3e00 = local_3e00 + 0x10;
        local_3f88 = local_3f88 + 4;
      }
      for (; local_3f88 + 1 < iVar1; local_3f88 = local_3f88 + 2) {
        local_700 = (float)*local_3e50;
        fStack_6fc = (float)((ulong)*local_3e50 >> 0x20);
        fStack_6f8 = (float)local_3e50[1];
        fStack_6f4 = (float)((ulong)local_3e50[1] >> 0x20);
        fStack_6f0 = (float)local_3e50[2];
        fStack_6ec = (float)((ulong)local_3e50[2] >> 0x20);
        fStack_6e8 = (float)local_3e50[3];
        local_6c0 = (float)local_3e50[8];
        fStack_6bc = (float)((ulong)local_3e50[8] >> 0x20);
        fStack_6b8 = (float)local_3e50[9];
        fStack_6b4 = (float)((ulong)local_3e50[9] >> 0x20);
        fStack_6b0 = (float)local_3e50[10];
        fStack_6ac = (float)((ulong)local_3e50[10] >> 0x20);
        fStack_6a8 = (float)local_3e50[0xb];
        local_680 = (float)local_3e50[4];
        fStack_67c = (float)((ulong)local_3e50[4] >> 0x20);
        fStack_678 = (float)local_3e50[5];
        fStack_674 = (float)((ulong)local_3e50[5] >> 0x20);
        fStack_670 = (float)local_3e50[6];
        fStack_66c = (float)((ulong)local_3e50[6] >> 0x20);
        fStack_668 = (float)local_3e50[7];
        local_640 = (float)local_3e50[0xc];
        fStack_63c = (float)((ulong)local_3e50[0xc] >> 0x20);
        fStack_638 = (float)local_3e50[0xd];
        fStack_634 = (float)((ulong)local_3e50[0xd] >> 0x20);
        fStack_630 = (float)local_3e50[0xe];
        fStack_62c = (float)((ulong)local_3e50[0xe] >> 0x20);
        fStack_628 = (float)local_3e50[0xf];
        local_5c0 = (float)local_3e50[0x10];
        fStack_5bc = (float)((ulong)local_3e50[0x10] >> 0x20);
        fStack_5b8 = (float)local_3e50[0x11];
        fStack_5b4 = (float)((ulong)local_3e50[0x11] >> 0x20);
        fStack_5b0 = (float)local_3e50[0x12];
        fStack_5ac = (float)((ulong)local_3e50[0x12] >> 0x20);
        fStack_5a8 = (float)local_3e50[0x13];
        local_580 = (float)*local_3e58;
        fStack_57c = (float)((ulong)*local_3e58 >> 0x20);
        fStack_578 = (float)local_3e58[1];
        fStack_574 = (float)((ulong)local_3e58[1] >> 0x20);
        fStack_570 = (float)local_3e58[2];
        fStack_56c = (float)((ulong)local_3e58[2] >> 0x20);
        fStack_568 = (float)local_3e58[3];
        local_540 = (float)local_3e58[8];
        fStack_53c = (float)((ulong)local_3e58[8] >> 0x20);
        fStack_538 = (float)local_3e58[9];
        fStack_534 = (float)((ulong)local_3e58[9] >> 0x20);
        fStack_530 = (float)local_3e58[10];
        fStack_52c = (float)((ulong)local_3e58[10] >> 0x20);
        fStack_528 = (float)local_3e58[0xb];
        local_500 = (float)local_3e58[4];
        fStack_4fc = (float)((ulong)local_3e58[4] >> 0x20);
        fStack_4f8 = (float)local_3e58[5];
        fStack_4f4 = (float)((ulong)local_3e58[5] >> 0x20);
        fStack_4f0 = (float)local_3e58[6];
        fStack_4ec = (float)((ulong)local_3e58[6] >> 0x20);
        fStack_4e8 = (float)local_3e58[7];
        local_4c0 = (float)local_3e58[0xc];
        fStack_4bc = (float)((ulong)local_3e58[0xc] >> 0x20);
        fStack_4b8 = (float)local_3e58[0xd];
        fStack_4b4 = (float)((ulong)local_3e58[0xd] >> 0x20);
        fStack_4b0 = (float)local_3e58[0xe];
        fStack_4ac = (float)((ulong)local_3e58[0xe] >> 0x20);
        fStack_4a8 = (float)local_3e58[0xf];
        local_440 = (float)local_3e58[0x10];
        fStack_43c = (float)((ulong)local_3e58[0x10] >> 0x20);
        fStack_438 = (float)local_3e58[0x11];
        fStack_434 = (float)((ulong)local_3e58[0x11] >> 0x20);
        fStack_430 = (float)local_3e58[0x12];
        fStack_42c = (float)((ulong)local_3e58[0x12] >> 0x20);
        fStack_428 = (float)local_3e58[0x13];
        local_400 = (float)*local_3e60;
        fStack_3fc = (float)((ulong)*local_3e60 >> 0x20);
        fStack_3f8 = (float)local_3e60[1];
        fStack_3f4 = (float)((ulong)local_3e60[1] >> 0x20);
        fStack_3f0 = (float)local_3e60[2];
        fStack_3ec = (float)((ulong)local_3e60[2] >> 0x20);
        fStack_3e8 = (float)local_3e60[3];
        local_3c0 = (float)local_3e60[8];
        fStack_3bc = (float)((ulong)local_3e60[8] >> 0x20);
        fStack_3b8 = (float)local_3e60[9];
        fStack_3b4 = (float)((ulong)local_3e60[9] >> 0x20);
        fStack_3b0 = (float)local_3e60[10];
        fStack_3ac = (float)((ulong)local_3e60[10] >> 0x20);
        fStack_3a8 = (float)local_3e60[0xb];
        local_380 = (float)local_3e60[4];
        fStack_37c = (float)((ulong)local_3e60[4] >> 0x20);
        fStack_378 = (float)local_3e60[5];
        fStack_374 = (float)((ulong)local_3e60[5] >> 0x20);
        fStack_370 = (float)local_3e60[6];
        fStack_36c = (float)((ulong)local_3e60[6] >> 0x20);
        fStack_368 = (float)local_3e60[7];
        local_340 = (float)local_3e60[0xc];
        fStack_33c = (float)((ulong)local_3e60[0xc] >> 0x20);
        fStack_338 = (float)local_3e60[0xd];
        fStack_334 = (float)((ulong)local_3e60[0xd] >> 0x20);
        fStack_330 = (float)local_3e60[0xe];
        fStack_32c = (float)((ulong)local_3e60[0xe] >> 0x20);
        fStack_328 = (float)local_3e60[0xf];
        local_2c0 = (float)local_3e60[0x10];
        fStack_2bc = (float)((ulong)local_3e60[0x10] >> 0x20);
        fStack_2b8 = (float)local_3e60[0x11];
        fStack_2b4 = (float)((ulong)local_3e60[0x11] >> 0x20);
        fStack_2b0 = (float)local_3e60[0x12];
        fStack_2ac = (float)((ulong)local_3e60[0x12] >> 0x20);
        fStack_2a8 = (float)local_3e60[0x13];
        *local_3e00 = CONCAT44(fStack_30bc * fStack_3bc +
                               fStack_2f3c * fStack_37c +
                               fStack_2dbc * fStack_3fc +
                               fStack_2c3c * fStack_53c +
                               fStack_2abc * fStack_4fc +
                               fStack_293c * fStack_57c +
                               fStack_27bc * fStack_6bc +
                               fStack_263c * fStack_67c + fStack_24bc * fStack_6fc + fStack_1fbc,
                               local_30c0 * local_3c0 +
                               local_2f40 * local_380 +
                               local_2dc0 * local_400 +
                               local_2c40 * local_540 +
                               local_2ac0 * local_500 +
                               local_2940 * local_580 +
                               local_27c0 * local_6c0 +
                               local_2640 * local_680 + local_24c0 * local_700 + local_1fc0);
        local_3e00[1] =
             CONCAT44(fStack_30b4 * fStack_3b4 +
                      fStack_2f34 * fStack_374 +
                      fStack_2db4 * fStack_3f4 +
                      fStack_2c34 * fStack_534 +
                      fStack_2ab4 * fStack_4f4 +
                      fStack_2934 * fStack_574 +
                      fStack_27b4 * fStack_6b4 +
                      fStack_2634 * fStack_674 + fStack_24b4 * fStack_6f4 + fStack_1fb4,
                      fStack_30b8 * fStack_3b8 +
                      fStack_2f38 * fStack_378 +
                      fStack_2db8 * fStack_3f8 +
                      fStack_2c38 * fStack_538 +
                      fStack_2ab8 * fStack_4f8 +
                      fStack_2938 * fStack_578 +
                      fStack_27b8 * fStack_6b8 +
                      fStack_2638 * fStack_678 + fStack_24b8 * fStack_6f8 + fStack_1fb8);
        local_3e00[2] =
             CONCAT44(fStack_30ac * fStack_3ac +
                      fStack_2f2c * fStack_36c +
                      fStack_2dac * fStack_3ec +
                      fStack_2c2c * fStack_52c +
                      fStack_2aac * fStack_4ec +
                      fStack_292c * fStack_56c +
                      fStack_27ac * fStack_6ac +
                      fStack_262c * fStack_66c + fStack_24ac * fStack_6ec + fStack_1fac,
                      fStack_30b0 * fStack_3b0 +
                      fStack_2f30 * fStack_370 +
                      fStack_2db0 * fStack_3f0 +
                      fStack_2c30 * fStack_530 +
                      fStack_2ab0 * fStack_4f0 +
                      fStack_2930 * fStack_570 +
                      fStack_27b0 * fStack_6b0 +
                      fStack_2630 * fStack_670 + fStack_24b0 * fStack_6f0 + fStack_1fb0);
        local_3e00[3] =
             CONCAT44(fStack_30a4 +
                      fStack_2f24 +
                      fStack_2da4 +
                      fStack_2c24 +
                      fStack_2aa4 +
                      fStack_2924 + fStack_27a4 + fStack_2624 + fStack_24a4 + fStack_1fa4,
                      fStack_30a8 * fStack_3a8 +
                      fStack_2f28 * fStack_368 +
                      fStack_2da8 * fStack_3e8 +
                      fStack_2c28 * fStack_528 +
                      fStack_2aa8 * fStack_4e8 +
                      fStack_2928 * fStack_568 +
                      fStack_27a8 * fStack_6a8 +
                      fStack_2628 * fStack_668 + fStack_24a8 * fStack_6e8 + fStack_1fa8);
        local_3e00[4] =
             CONCAT44(fStack_30bc * fStack_2bc +
                      fStack_2f3c * fStack_33c +
                      fStack_2dbc * fStack_3bc +
                      fStack_2c3c * fStack_43c +
                      fStack_2abc * fStack_4bc +
                      fStack_293c * fStack_53c +
                      fStack_27bc * fStack_5bc +
                      fStack_263c * fStack_63c + fStack_24bc * fStack_6bc + fStack_1fbc,
                      local_30c0 * local_2c0 +
                      local_2f40 * local_340 +
                      local_2dc0 * local_3c0 +
                      local_2c40 * local_440 +
                      local_2ac0 * local_4c0 +
                      local_2940 * local_540 +
                      local_27c0 * local_5c0 +
                      local_2640 * local_640 + local_24c0 * local_6c0 + local_1fc0);
        local_3e00[5] =
             CONCAT44(fStack_30b4 * fStack_2b4 +
                      fStack_2f34 * fStack_334 +
                      fStack_2db4 * fStack_3b4 +
                      fStack_2c34 * fStack_434 +
                      fStack_2ab4 * fStack_4b4 +
                      fStack_2934 * fStack_534 +
                      fStack_27b4 * fStack_5b4 +
                      fStack_2634 * fStack_634 + fStack_24b4 * fStack_6b4 + fStack_1fb4,
                      fStack_30b8 * fStack_2b8 +
                      fStack_2f38 * fStack_338 +
                      fStack_2db8 * fStack_3b8 +
                      fStack_2c38 * fStack_438 +
                      fStack_2ab8 * fStack_4b8 +
                      fStack_2938 * fStack_538 +
                      fStack_27b8 * fStack_5b8 +
                      fStack_2638 * fStack_638 + fStack_24b8 * fStack_6b8 + fStack_1fb8);
        local_3e00[6] =
             CONCAT44(fStack_30ac * fStack_2ac +
                      fStack_2f2c * fStack_32c +
                      fStack_2dac * fStack_3ac +
                      fStack_2c2c * fStack_42c +
                      fStack_2aac * fStack_4ac +
                      fStack_292c * fStack_52c +
                      fStack_27ac * fStack_5ac +
                      fStack_262c * fStack_62c + fStack_24ac * fStack_6ac + fStack_1fac,
                      fStack_30b0 * fStack_2b0 +
                      fStack_2f30 * fStack_330 +
                      fStack_2db0 * fStack_3b0 +
                      fStack_2c30 * fStack_430 +
                      fStack_2ab0 * fStack_4b0 +
                      fStack_2930 * fStack_530 +
                      fStack_27b0 * fStack_5b0 +
                      fStack_2630 * fStack_630 + fStack_24b0 * fStack_6b0 + fStack_1fb0);
        local_3e00[7] =
             CONCAT44(fStack_30a4 +
                      fStack_2f24 +
                      fStack_2da4 +
                      fStack_2c24 +
                      fStack_2aa4 +
                      fStack_2924 + fStack_27a4 + fStack_2624 + fStack_24a4 + fStack_1fa4,
                      fStack_30a8 * fStack_2a8 +
                      fStack_2f28 * fStack_328 +
                      fStack_2da8 * fStack_3a8 +
                      fStack_2c28 * fStack_428 +
                      fStack_2aa8 * fStack_4a8 +
                      fStack_2928 * fStack_528 +
                      fStack_27a8 * fStack_5a8 +
                      fStack_2628 * fStack_628 + fStack_24a8 * fStack_6a8 + fStack_1fa8);
        local_3e50 = local_3e50 + 0x10;
        local_3e58 = local_3e58 + 0x10;
        local_3e60 = local_3e60 + 0x10;
        local_3e00 = local_3e00 + 8;
      }
      for (; local_3f88 < iVar1; local_3f88 = local_3f88 + 1) {
        local_280 = (float)*local_3e50;
        fStack_27c = (float)((ulong)*local_3e50 >> 0x20);
        fStack_278 = (float)local_3e50[1];
        fStack_274 = (float)((ulong)local_3e50[1] >> 0x20);
        fStack_270 = (float)local_3e50[2];
        fStack_26c = (float)((ulong)local_3e50[2] >> 0x20);
        fStack_268 = (float)local_3e50[3];
        local_240 = (float)local_3e50[4];
        fStack_23c = (float)((ulong)local_3e50[4] >> 0x20);
        fStack_238 = (float)local_3e50[5];
        fStack_234 = (float)((ulong)local_3e50[5] >> 0x20);
        fStack_230 = (float)local_3e50[6];
        fStack_22c = (float)((ulong)local_3e50[6] >> 0x20);
        fStack_228 = (float)local_3e50[7];
        local_200 = (float)local_3e50[8];
        fStack_1fc = (float)((ulong)local_3e50[8] >> 0x20);
        fStack_1f8 = (float)local_3e50[9];
        fStack_1f4 = (float)((ulong)local_3e50[9] >> 0x20);
        fStack_1f0 = (float)local_3e50[10];
        fStack_1ec = (float)((ulong)local_3e50[10] >> 0x20);
        fStack_1e8 = (float)local_3e50[0xb];
        local_1c0 = (float)*local_3e58;
        fStack_1bc = (float)((ulong)*local_3e58 >> 0x20);
        fStack_1b8 = (float)local_3e58[1];
        fStack_1b4 = (float)((ulong)local_3e58[1] >> 0x20);
        fStack_1b0 = (float)local_3e58[2];
        fStack_1ac = (float)((ulong)local_3e58[2] >> 0x20);
        fStack_1a8 = (float)local_3e58[3];
        local_180 = (float)local_3e58[4];
        fStack_17c = (float)((ulong)local_3e58[4] >> 0x20);
        fStack_178 = (float)local_3e58[5];
        fStack_174 = (float)((ulong)local_3e58[5] >> 0x20);
        fStack_170 = (float)local_3e58[6];
        fStack_16c = (float)((ulong)local_3e58[6] >> 0x20);
        fStack_168 = (float)local_3e58[7];
        local_140 = (float)local_3e58[8];
        fStack_13c = (float)((ulong)local_3e58[8] >> 0x20);
        fStack_138 = (float)local_3e58[9];
        fStack_134 = (float)((ulong)local_3e58[9] >> 0x20);
        fStack_130 = (float)local_3e58[10];
        fStack_12c = (float)((ulong)local_3e58[10] >> 0x20);
        fStack_128 = (float)local_3e58[0xb];
        local_100 = (float)*local_3e60;
        fStack_fc = (float)((ulong)*local_3e60 >> 0x20);
        fStack_f8 = (float)local_3e60[1];
        fStack_f4 = (float)((ulong)local_3e60[1] >> 0x20);
        fStack_f0 = (float)local_3e60[2];
        fStack_ec = (float)((ulong)local_3e60[2] >> 0x20);
        fStack_e8 = (float)local_3e60[3];
        local_c0 = (float)local_3e60[4];
        fStack_bc = (float)((ulong)local_3e60[4] >> 0x20);
        fStack_b8 = (float)local_3e60[5];
        fStack_b4 = (float)((ulong)local_3e60[5] >> 0x20);
        fStack_b0 = (float)local_3e60[6];
        fStack_ac = (float)((ulong)local_3e60[6] >> 0x20);
        fStack_a8 = (float)local_3e60[7];
        local_80 = (float)local_3e60[8];
        fStack_7c = (float)((ulong)local_3e60[8] >> 0x20);
        fStack_78 = (float)local_3e60[9];
        fStack_74 = (float)((ulong)local_3e60[9] >> 0x20);
        fStack_70 = (float)local_3e60[10];
        fStack_6c = (float)((ulong)local_3e60[10] >> 0x20);
        fStack_68 = (float)local_3e60[0xb];
        *local_3e00 = CONCAT44(fStack_30bc * fStack_7c +
                               fStack_2f3c * fStack_bc +
                               fStack_2dbc * fStack_fc +
                               fStack_2c3c * fStack_13c +
                               fStack_2abc * fStack_17c +
                               fStack_293c * fStack_1bc +
                               fStack_27bc * fStack_1fc +
                               fStack_263c * fStack_23c + fStack_24bc * fStack_27c + fStack_1fbc,
                               local_30c0 * local_80 +
                               local_2f40 * local_c0 +
                               local_2dc0 * local_100 +
                               local_2c40 * local_140 +
                               local_2ac0 * local_180 +
                               local_2940 * local_1c0 +
                               local_27c0 * local_200 +
                               local_2640 * local_240 + local_24c0 * local_280 + local_1fc0);
        local_3e00[1] =
             CONCAT44(fStack_30b4 * fStack_74 +
                      fStack_2f34 * fStack_b4 +
                      fStack_2db4 * fStack_f4 +
                      fStack_2c34 * fStack_134 +
                      fStack_2ab4 * fStack_174 +
                      fStack_2934 * fStack_1b4 +
                      fStack_27b4 * fStack_1f4 +
                      fStack_2634 * fStack_234 + fStack_24b4 * fStack_274 + fStack_1fb4,
                      fStack_30b8 * fStack_78 +
                      fStack_2f38 * fStack_b8 +
                      fStack_2db8 * fStack_f8 +
                      fStack_2c38 * fStack_138 +
                      fStack_2ab8 * fStack_178 +
                      fStack_2938 * fStack_1b8 +
                      fStack_27b8 * fStack_1f8 +
                      fStack_2638 * fStack_238 + fStack_24b8 * fStack_278 + fStack_1fb8);
        local_3e00[2] =
             CONCAT44(fStack_30ac * fStack_6c +
                      fStack_2f2c * fStack_ac +
                      fStack_2dac * fStack_ec +
                      fStack_2c2c * fStack_12c +
                      fStack_2aac * fStack_16c +
                      fStack_292c * fStack_1ac +
                      fStack_27ac * fStack_1ec +
                      fStack_262c * fStack_22c + fStack_24ac * fStack_26c + fStack_1fac,
                      fStack_30b0 * fStack_70 +
                      fStack_2f30 * fStack_b0 +
                      fStack_2db0 * fStack_f0 +
                      fStack_2c30 * fStack_130 +
                      fStack_2ab0 * fStack_170 +
                      fStack_2930 * fStack_1b0 +
                      fStack_27b0 * fStack_1f0 +
                      fStack_2630 * fStack_230 + fStack_24b0 * fStack_270 + fStack_1fb0);
        local_3e00[3] =
             CONCAT44(fStack_30a4 +
                      fStack_2f24 +
                      fStack_2da4 +
                      fStack_2c24 +
                      fStack_2aa4 +
                      fStack_2924 + fStack_27a4 + fStack_2624 + fStack_24a4 + fStack_1fa4,
                      fStack_30a8 * fStack_68 +
                      fStack_2f28 * fStack_a8 +
                      fStack_2da8 * fStack_e8 +
                      fStack_2c28 * fStack_128 +
                      fStack_2aa8 * fStack_168 +
                      fStack_2928 * fStack_1a8 +
                      fStack_27a8 * fStack_1e8 +
                      fStack_2628 * fStack_228 + fStack_24a8 * fStack_268 + fStack_1fa8);
        local_3e50 = local_3e50 + 8;
        local_3e58 = local_3e58 + 8;
        local_3e60 = local_3e60 + 8;
        local_3e00 = local_3e00 + 4;
      }
      local_3e50 = (undefined8 *)((long)local_3e50 + (long)iVar41 * 4);
      local_3e58 = (undefined8 *)((long)local_3e58 + (long)iVar41 * 4);
      local_3e60 = (undefined8 *)((long)local_3e60 + (long)iVar41 * 4);
    }
  }
  return;
}

Assistant:

static void convdw3x3s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_load_ps(k0);
        __m256 _k01 = _mm256_load_ps(k0 + 8);
        __m256 _k02 = _mm256_load_ps(k0 + 16);
        __m256 _k10 = _mm256_load_ps(k0 + 24);
        __m256 _k11 = _mm256_load_ps(k0 + 32);
        __m256 _k12 = _mm256_load_ps(k0 + 40);
        __m256 _k20 = _mm256_load_ps(k0 + 48);
        __m256 _k21 = _mm256_load_ps(k0 + 56);
        __m256 _k22 = _mm256_load_ps(k0 + 64);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;
                __m256 _sum2 = _bias0;
                __m256 _sum3 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);
                __m256 _r06 = _mm256_load_ps(r0 + 48);
                __m256 _r07 = _mm256_load_ps(r0 + 56);
                __m256 _r08 = _mm256_load_ps(r0 + 64);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r08, _sum3);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);
                __m256 _r16 = _mm256_load_ps(r1 + 48);
                __m256 _r17 = _mm256_load_ps(r1 + 56);
                __m256 _r18 = _mm256_load_ps(r1 + 64);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r18, _sum3);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);
                __m256 _r26 = _mm256_load_ps(r2 + 48);
                __m256 _r27 = _mm256_load_ps(r2 + 56);
                __m256 _r28 = _mm256_load_ps(r2 + 64);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r26, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);
                _mm256_store_ps(outptr0 + 16, _sum2);
                _mm256_store_ps(outptr0 + 24, _sum3);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}